

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O2

photonstream * __thiscall
NEST::NESTcalc::AddPhotonTransportTime
          (photonstream *__return_storage_ptr__,NESTcalc *this,photonstream *emitted_times,double x,
          double y,double z)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double extraout_XMM0_Qa;
  double newtime;
  double local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pdVar2 = (emitted_times->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (emitted_times->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
    dVar1 = *pdVar3;
    (*this->fdetector->_vptr_VDetector[8])(x,y,z);
    local_30 = dVar1 + extraout_XMM0_Qa;
    std::vector<double,std::allocator<double>>::emplace_back<double&>
              ((vector<double,std::allocator<double>> *)__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

photonstream NESTcalc::AddPhotonTransportTime(const photonstream &emitted_times,
                                              double x, double y, double z) {
  photonstream return_photons;
  for (auto t : emitted_times) {
    double newtime = t + fdetector->OptTrans(x, y, z);
    return_photons.emplace_back(newtime);
  }
  return return_photons;
}